

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# retention.cc
# Opt level: O1

void google::protobuf::compiler::StripSourceRetentionOptions
               (DescriptorPool *pool,FileDescriptorProto *file_proto)

{
  RepeatedPtrField<google::protobuf::SourceCodeInfo_Location> *this;
  uint uVar1;
  pointer __s1;
  pointer piVar2;
  pointer __s2;
  SourceCodeInfo_Location *value;
  undefined8 uVar3;
  undefined8 uVar4;
  int iVar5;
  SourceCodeInfo *pSVar6;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::SourceCodeInfo_Location>_>
  *pVVar7;
  size_t sVar8;
  pointer piVar9;
  int *key;
  ulong uVar10;
  size_t __n;
  pointer pvVar11;
  Arena *arena;
  pointer ppVar12;
  bool bVar13;
  iterator iVar14;
  vector<google::protobuf::SourceCodeInfo_Location_*,_std::allocator<google::protobuf::SourceCodeInfo_Location_*>_>
  old_locations;
  vector<std::pair<absl::lts_20250127::Span<const_int>,_int>,_std::allocator<std::pair<absl::lts_20250127::Span<const_int>,_int>_>_>
  sorted_locations;
  flat_hash_set<int,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<int>_>
  indices_to_delete;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  stripped_paths;
  undefined1 local_c8 [16];
  pointer local_b8;
  RepeatedPtrFieldBase *local_a8;
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<int>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<int>_>
  *local_a0;
  vector<std::pair<absl::lts_20250127::Span<const_int>,_int>,_std::allocator<std::pair<absl::lts_20250127::Span<const_int>,_int>_>_>
  local_98;
  SourceCodeInfo *local_80;
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<int>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<int>_>
  local_78;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  local_58;
  pointer local_38;
  
  local_58.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  anon_unknown_0::ConvertToDynamicMessageAndStripOptions(&file_proto->super_Message,pool,&local_58);
  uVar1 = (file_proto->field_0)._impl_._has_bits_.has_bits_[0];
  pSVar6 = (file_proto->field_0)._impl_.source_code_info_;
  if ((pSVar6 == (SourceCodeInfo *)0x0 & (byte)uVar1 >> 4) == 1) {
    protobuf::internal::protobuf_assumption_failed
              ("!value || _impl_.source_code_info_ != nullptr",
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.pb.h"
               ,0x33e3);
  }
  if ((uVar1 & 0x10) != 0) {
    (file_proto->field_0)._impl_._has_bits_.has_bits_[0] = uVar1;
    if (pSVar6 == (SourceCodeInfo *)0x0) {
      arena = (Arena *)(file_proto->super_Message).super_MessageLite._internal_metadata_.ptr_;
      if (((ulong)arena & 1) != 0) {
        arena = *(Arena **)((ulong)arena & 0xfffffffffffffffe);
      }
      pSVar6 = (SourceCodeInfo *)Arena::DefaultConstruct<google::protobuf::SourceCodeInfo>(arena);
      (file_proto->field_0)._impl_.source_code_info_ = pSVar6;
    }
    pSVar6 = (file_proto->field_0)._impl_.source_code_info_;
    local_98.
    super__Vector_base<std::pair<absl::lts_20250127::Span<const_int>,_int>,_std::allocator<std::pair<absl::lts_20250127::Span<const_int>,_int>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_98.
    super__Vector_base<std::pair<absl::lts_20250127::Span<const_int>,_int>,_std::allocator<std::pair<absl::lts_20250127::Span<const_int>,_int>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_98.
    super__Vector_base<std::pair<absl::lts_20250127::Span<const_int>,_int>,_std::allocator<std::pair<absl::lts_20250127::Span<const_int>,_int>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::
    vector<std::pair<absl::lts_20250127::Span<const_int>,_int>,_std::allocator<std::pair<absl::lts_20250127::Span<const_int>,_int>_>_>
    ::reserve(&local_98,(long)*(int *)((long)&pSVar6->field_0 + 0x20));
    this = &(pSVar6->field_0)._impl_.location_;
    local_78.settings_.
    super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<int>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
    .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.capacity_
    ._0_4_ = 0;
    iVar5 = (int)local_78.settings_.
                 super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<int>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                 .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.
                 value.capacity_;
    local_78.settings_.
    super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<int>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
    .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.capacity_
    ._0_4_ = 0;
    if (0 < *(int *)((long)&pSVar6->field_0 + 0x20)) {
      do {
        pVVar7 = protobuf::internal::RepeatedPtrFieldBase::
                 Mutable<google::protobuf::internal::GenericTypeHandler<google::protobuf::SourceCodeInfo_Location>>
                           (&this->super_RepeatedPtrFieldBase,
                            (int)local_78.settings_.
                                 super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<int>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                                 .
                                 super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>
                                 .value.capacity_);
        std::
        vector<std::pair<absl::lts_20250127::Span<int_const>,int>,std::allocator<std::pair<absl::lts_20250127::Span<int_const>,int>>>
        ::emplace_back<google::protobuf::RepeatedField<int>const&,int&>
                  ((vector<std::pair<absl::lts_20250127::Span<int_const>,int>,std::allocator<std::pair<absl::lts_20250127::Span<int_const>,int>>>
                    *)&local_98,&(pVVar7->field_0)._impl_.path_,(int *)&local_78);
        local_78.settings_.
        super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<int>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
        .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.
        capacity_._0_4_ =
             (int)local_78.settings_.
                  super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<int>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                  .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.
                  value.capacity_ + 1;
        iVar5 = (int)local_78.settings_.
                     super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<int>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                     .
                     super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>
                     .value.capacity_;
      } while ((int)local_78.settings_.
                    super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<int>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                    .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>
                    .value.capacity_ < *(int *)((long)&pSVar6->field_0 + 0x20));
    }
    local_78.settings_.
    super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<int>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
    .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.capacity_
    ._0_4_ = iVar5;
    absl::lts_20250127::
    c_sort<std::vector<std::pair<absl::lts_20250127::Span<int_const>,int>,std::allocator<std::pair<absl::lts_20250127::Span<int_const>,int>>>>
              (&local_98);
    absl::lts_20250127::
    c_sort<std::vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>>
              (&local_58);
    local_78.settings_.
    super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<int>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
    .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.capacity_
         = 1;
    local_78.settings_.
    super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<int>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
    .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.size_ = 0
    ;
    local_a8 = &this->super_RepeatedPtrFieldBase;
    if ((local_58.
         super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start !=
         local_58.
         super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish) &&
       (pvVar11 = local_58.
                  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start,
       ppVar12 = local_98.
                 super__Vector_base<std::pair<absl::lts_20250127::Span<const_int>,_int>,_std::allocator<std::pair<absl::lts_20250127::Span<const_int>,_int>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,
       local_98.
       super__Vector_base<std::pair<absl::lts_20250127::Span<const_int>,_int>,_std::allocator<std::pair<absl::lts_20250127::Span<const_int>,_int>_>_>
       ._M_impl.super__Vector_impl_data._M_start !=
       local_98.
       super__Vector_base<std::pair<absl::lts_20250127::Span<const_int>,_int>,_std::allocator<std::pair<absl::lts_20250127::Span<const_int>,_int>_>_>
       ._M_impl.super__Vector_impl_data._M_finish)) {
      do {
        local_80 = pSVar6;
        __s1 = (pvVar11->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_start;
        piVar2 = (pvVar11->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
        __n = (long)piVar2 - (long)__s1;
        __s2 = (ppVar12->first).ptr_;
        uVar10 = (ppVar12->first).len_;
        if ((uVar10 < (ulong)((long)__n >> 2)) ||
           ((piVar2 != __s1 &&
            (local_38 = pvVar11, iVar5 = bcmp(__s1,__s2,__n), pvVar11 = local_38, iVar5 != 0)))) {
          if ((long)uVar10 < (long)__n >> 2) {
            __n = uVar10 * 4;
          }
          piVar9 = __s2;
          if (__n != 0) {
            sVar8 = 0;
            do {
              if (*(int *)((long)__s2 + sVar8) != *(int *)((long)__s1 + sVar8)) {
                bVar13 = *(int *)((long)__s1 + sVar8) < *(int *)((long)__s2 + sVar8);
                goto LAB_002019d3;
              }
              sVar8 = sVar8 + 4;
            } while (__n != sVar8);
            piVar9 = (pointer)(sVar8 + (long)__s2);
          }
          bVar13 = piVar9 != __s2 + uVar10;
LAB_002019d3:
          if (bVar13) {
            pvVar11 = pvVar11 + 1;
          }
          else {
            ppVar12 = ppVar12 + 1;
          }
        }
        else {
          local_a0 = &local_78;
          absl::lts_20250127::container_internal::
          raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<int>,absl::lts_20250127::hash_internal::Hash<int>,std::equal_to<int>,std::allocator<int>>
          ::EmplaceDecomposable::operator()
                    ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<int>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<int>_>::iterator,_bool>
                      *)local_c8,&local_a0,&ppVar12->second,&ppVar12->second);
          ppVar12 = ppVar12 + 1;
        }
        pSVar6 = local_80;
      } while ((pvVar11 !=
                local_58.
                super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish) &&
              (ppVar12 !=
               local_98.
               super__Vector_base<std::pair<absl::lts_20250127::Span<const_int>,_int>,_std::allocator<std::pair<absl::lts_20250127::Span<const_int>,_int>_>_>
               ._M_impl.super__Vector_impl_data._M_finish));
    }
    local_c8._0_8_ = (SourceCodeInfo_Location **)0x0;
    local_c8._8_8_ = (SourceCodeInfo_Location **)0x0;
    local_b8 = (pointer)0x0;
    std::
    vector<google::protobuf::SourceCodeInfo_Location_*,_std::allocator<google::protobuf::SourceCodeInfo_Location_*>_>
    ::resize((vector<google::protobuf::SourceCodeInfo_Location_*,_std::allocator<google::protobuf::SourceCodeInfo_Location_*>_>
              *)local_c8,(long)*(int *)((long)&pSVar6->field_0 + 0x20));
    RepeatedPtrField<google::protobuf::SourceCodeInfo_Location>::ExtractSubrange
              ((RepeatedPtrField<google::protobuf::SourceCodeInfo_Location> *)local_a8,0,
               *(int *)((long)&pSVar6->field_0 + 0x20),(SourceCodeInfo_Location **)local_c8._0_8_);
    uVar4 = local_c8._8_8_;
    uVar3 = local_c8._0_8_;
    absl::lts_20250127::container_internal::
    raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<int>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<int>_>
    ::AssertNotDebugCapacity(&local_78);
    protobuf::internal::RepeatedPtrFieldBase::Reserve
              (local_a8,(int)((ulong)(uVar4 - uVar3) >> 3) -
                        (int)(local_78.settings_.
                              super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<int>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                              .
                              super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>
                              .value.size_ >> 1));
    if (local_c8._8_8_ != local_c8._0_8_) {
      uVar10 = 0;
      do {
        local_a0 = (raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<int>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<int>_>
                    *)CONCAT44(local_a0._4_4_,(int)uVar10);
        iVar14 = absl::lts_20250127::container_internal::
                 raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<int>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<int>_>
                 ::find<int>(&local_78,(key_arg<int> *)&local_a0);
        absl::lts_20250127::container_internal::
        raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<int>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<int>_>
        ::AssertNotDebugCapacity(&local_78);
        value = *(SourceCodeInfo_Location **)(local_c8._0_8_ + uVar10 * 8);
        if (iVar14.ctrl_ == (ctrl_t *)0x0) {
          protobuf::internal::RepeatedPtrFieldBase::
          AddAllocated<google::protobuf::internal::GenericTypeHandler<google::protobuf::SourceCodeInfo_Location>>
                    (local_a8,value);
        }
        else if (value != (SourceCodeInfo_Location *)0x0) {
          SourceCodeInfo_Location::~SourceCodeInfo_Location(value);
          operator_delete(value,0x70);
        }
        uVar10 = uVar10 + 1;
      } while (uVar10 < (ulong)((long)(local_c8._8_8_ - local_c8._0_8_) >> 3));
    }
    if ((SourceCodeInfo_Location **)local_c8._0_8_ != (SourceCodeInfo_Location **)0x0) {
      operator_delete((void *)local_c8._0_8_,(long)local_b8 - local_c8._0_8_);
    }
    absl::lts_20250127::container_internal::
    raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<int>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<int>_>
    ::destructor_impl(&local_78);
    if (local_98.
        super__Vector_base<std::pair<absl::lts_20250127::Span<const_int>,_int>,_std::allocator<std::pair<absl::lts_20250127::Span<const_int>,_int>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_98.
                      super__Vector_base<std::pair<absl::lts_20250127::Span<const_int>,_int>,_std::allocator<std::pair<absl::lts_20250127::Span<const_int>,_int>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_98.
                            super__Vector_base<std::pair<absl::lts_20250127::Span<const_int>,_int>,_std::allocator<std::pair<absl::lts_20250127::Span<const_int>,_int>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_98.
                            super__Vector_base<std::pair<absl::lts_20250127::Span<const_int>,_int>,_std::allocator<std::pair<absl::lts_20250127::Span<const_int>,_int>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
  }
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector(&local_58);
  return;
}

Assistant:

void StripSourceRetentionOptions(const DescriptorPool& pool,
                                 FileDescriptorProto& file_proto) {
  std::vector<std::vector<int>> stripped_paths;
  ConvertToDynamicMessageAndStripOptions(file_proto, pool, &stripped_paths);
  if (file_proto.has_source_code_info()) {
    StripSourceCodeInfo(stripped_paths, *file_proto.mutable_source_code_info());
  }
}